

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O3

void __thiscall tst_RoleMaskProxyModel::testRemoveRows_data(tst_RoleMaskProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  __atomic_base<int> _Var2;
  QTestData *pQVar3;
  QAbstractItemModel *baseModel;
  QAbstractItemModel *local_a0;
  QMetaTypeInterface *local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  int local_80 [6];
  QAbstractItemModel *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  int local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_98 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var2._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
               super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var2._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var2._M_i,"baseModel");
  QTest::addColumnInternal(2,"removeIndex");
  QTest::addColumnInternal(0x2a,"parentIndex");
  pQVar3 = (QTestData *)QTest::newRow("List Remove Begin");
  local_68 = createListModel(&this->super_QObject);
  pQVar3 = operator<<(pQVar3,&local_68);
  local_80[0] = 0;
  QTestData::append((int)pQVar3,(void *)0x2);
  local_98 = (QMetaTypeInterface *)0xffffffffffffffff;
  local_90 = 0;
  uStack_88 = 0;
  QTestData::append((int)pQVar3,(void *)0x2a);
  pQVar3 = (QTestData *)QTest::newRow("Table Remove Begin");
  local_68 = createTableModel(&this->super_QObject);
  pQVar3 = operator<<(pQVar3,&local_68);
  local_80[0] = 0;
  QTestData::append((int)pQVar3,(void *)0x2);
  local_98 = (QMetaTypeInterface *)0xffffffffffffffff;
  local_90 = 0;
  uStack_88 = 0;
  QTestData::append((int)pQVar3,(void *)0x2a);
  pQVar3 = (QTestData *)QTest::newRow("Tree Remove Begin");
  local_68 = createTreeModel(&this->super_QObject);
  pQVar3 = operator<<(pQVar3,&local_68);
  local_80[0] = 0;
  QTestData::append((int)pQVar3,(void *)0x2);
  local_98 = (QMetaTypeInterface *)0xffffffffffffffff;
  local_90 = 0;
  uStack_88 = 0;
  QTestData::append((int)pQVar3,(void *)0x2a);
  local_a0 = createListModel(&this->super_QObject);
  pQVar3 = (QTestData *)QTest::newRow("List Remove End");
  pQVar3 = operator<<(pQVar3,&local_a0);
  local_98 = (QMetaTypeInterface *)0xffffffffffffffff;
  local_90 = 0;
  uStack_88 = 0;
  local_80[0] = (**(code **)(*(long *)local_a0 + 0x78))(local_a0,&local_98);
  local_80[0] = local_80[0] + -1;
  QTestData::append((int)pQVar3,(void *)0x2);
  local_68 = (QAbstractItemModel *)0xffffffffffffffff;
  local_60 = 0;
  uStack_58 = 0;
  QTestData::append((int)pQVar3,(void *)0x2a);
  local_a0 = createTableModel(&this->super_QObject);
  if (local_a0 != (QAbstractItemModel *)0x0) {
    pQVar3 = (QTestData *)QTest::newRow("Table Remove End");
    pQVar3 = operator<<(pQVar3,&local_a0);
    local_98 = (QMetaTypeInterface *)0xffffffffffffffff;
    local_90 = 0;
    uStack_88 = 0;
    local_80[0] = (**(code **)(*(long *)local_a0 + 0x78))();
    local_80[0] = local_80[0] + -1;
    QTestData::append((int)pQVar3,(void *)0x2);
    local_68 = (QAbstractItemModel *)0xffffffffffffffff;
    local_60 = 0;
    uStack_58 = 0;
    QTestData::append((int)pQVar3,(void *)0x2a);
  }
  local_a0 = createTreeModel(&this->super_QObject);
  if (local_a0 != (QAbstractItemModel *)0x0) {
    pQVar3 = (QTestData *)QTest::newRow("Tree Remove End");
    pQVar3 = operator<<(pQVar3,&local_a0);
    local_98 = (QMetaTypeInterface *)0xffffffffffffffff;
    local_90 = 0;
    uStack_88 = 0;
    local_80[0] = (**(code **)(*(long *)local_a0 + 0x78))();
    local_80[0] = local_80[0] + -1;
    QTestData::append((int)pQVar3,(void *)0x2);
    local_68 = (QAbstractItemModel *)0xffffffffffffffff;
    local_60 = 0;
    uStack_58 = 0;
    QTestData::append((int)pQVar3,(void *)0x2a);
  }
  pQVar3 = (QTestData *)QTest::newRow("List Remove Middle");
  local_68 = createListModel(&this->super_QObject);
  pQVar3 = operator<<(pQVar3,&local_68);
  local_80[0] = 2;
  QTestData::append((int)pQVar3,(void *)0x2);
  local_98 = (QMetaTypeInterface *)0xffffffffffffffff;
  local_90 = 0;
  uStack_88 = 0;
  QTestData::append((int)pQVar3,(void *)0x2a);
  pQVar3 = (QTestData *)QTest::newRow("Table Remove Middle");
  local_68 = createTableModel(&this->super_QObject);
  pQVar3 = operator<<(pQVar3,&local_68);
  local_80[0] = 2;
  QTestData::append((int)pQVar3,(void *)0x2);
  local_98 = (QMetaTypeInterface *)0xffffffffffffffff;
  local_90 = 0;
  uStack_88 = 0;
  QTestData::append((int)pQVar3,(void *)0x2a);
  pQVar3 = (QTestData *)QTest::newRow("Tree Remove Middle");
  local_68 = createTreeModel(&this->super_QObject);
  pQVar3 = operator<<(pQVar3,&local_68);
  local_80[0] = 2;
  QTestData::append((int)pQVar3,(void *)0x2);
  local_98 = (QMetaTypeInterface *)0xffffffffffffffff;
  local_90 = 0;
  uStack_88 = 0;
  QTestData::append((int)pQVar3,(void *)0x2a);
  local_a0 = createTreeModel(&this->super_QObject);
  if (local_a0 != (QAbstractItemModel *)0x0) {
    pQVar3 = (QTestData *)QTest::newRow("Tree Remove Begin Child");
    pQVar3 = operator<<(pQVar3,&local_a0);
    local_80[0] = 0;
    QTestData::append((int)pQVar3,(void *)0x2);
    local_68 = (QAbstractItemModel *)0xffffffffffffffff;
    local_60 = 0;
    uStack_58 = 0;
    (**(code **)(*(long *)local_a0 + 0x60))(&local_98,local_a0,0,0);
    QTestData::append((int)pQVar3,(void *)0x2a);
  }
  local_a0 = createTreeModel(&this->super_QObject);
  if (local_a0 != (QAbstractItemModel *)0x0) {
    pQVar3 = (QTestData *)QTest::newRow("Tree Remove Middle Child");
    pQVar3 = operator<<(pQVar3,&local_a0);
    local_80[0] = 2;
    QTestData::append((int)pQVar3,(void *)0x2);
    local_68 = (QAbstractItemModel *)0xffffffffffffffff;
    local_60 = 0;
    uStack_58 = 0;
    (**(code **)(*(long *)local_a0 + 0x60))(&local_98,local_a0,0,0);
    QTestData::append((int)pQVar3,(void *)0x2a);
  }
  local_a0 = createTreeModel(&this->super_QObject);
  if (local_a0 != (QAbstractItemModel *)0x0) {
    pQVar3 = (QTestData *)QTest::newRow("Tree Remove End Child");
    pQVar3 = operator<<(pQVar3,&local_a0);
    pQVar1 = local_a0;
    local_68 = (QAbstractItemModel *)0xffffffffffffffff;
    local_60 = 0;
    uStack_58 = 0;
    (**(code **)(*(long *)local_a0 + 0x60))(&local_98,local_a0,0,0);
    local_4c = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_98);
    local_4c = local_4c + -1;
    QTestData::append((int)pQVar3,(void *)0x2);
    local_48 = 0xffffffffffffffff;
    local_40 = 0;
    uStack_38 = 0;
    (**(code **)(*(long *)local_a0 + 0x60))(local_80,local_a0,0,0);
    QTestData::append((int)pQVar3,(void *)0x2a);
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testRemoveRows_data()
{
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<int>("removeIndex");
    QTest::addColumn<QModelIndex>("parentIndex");
    QTest::newRow("List Remove Begin") << createListModel(this) << 0 << QModelIndex();
    QTest::newRow("Table Remove Begin") << createTableModel(this) << 0 << QModelIndex();
    QTest::newRow("Tree Remove Begin") << createTreeModel(this) << 0 << QModelIndex();
    QAbstractItemModel *baseModel = createListModel(this);
    QTest::newRow("List Remove End") << baseModel << baseModel->rowCount() - 1 << QModelIndex();
    baseModel = createTableModel(this);
    if (baseModel)
        QTest::newRow("Table Remove End") << baseModel << baseModel->rowCount() - 1 << QModelIndex();
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove End") << baseModel << baseModel->rowCount() - 1 << QModelIndex();
    QTest::newRow("List Remove Middle") << createListModel(this) << 2 << QModelIndex();
    QTest::newRow("Table Remove Middle") << createTableModel(this) << 2 << QModelIndex();
    QTest::newRow("Tree Remove Middle") << createTreeModel(this) << 2 << QModelIndex();

    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove Begin Child") << baseModel << 0 << baseModel->index(0, 0);
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove Middle Child") << baseModel << 2 << baseModel->index(0, 0);
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree Remove End Child") << baseModel << baseModel->rowCount(baseModel->index(0, 0)) - 1 << baseModel->index(0, 0);
}